

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O1

void Nf_ManPrintMatches(Nf_Man_t *p)

{
  uint uVar1;
  Nf_Obj_t *pNVar2;
  Gia_Man_t *pGVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  
  pGVar3 = p->pGia;
  if (0 < pGVar3->nObjs) {
    lVar4 = 0x38;
    lVar5 = 0;
    uVar6 = 0;
    do {
      if (pGVar3->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      uVar1 = *(uint *)(&pGVar3->pObjs->field_0x0 + lVar5);
      if ((~uVar1 & 0x1fffffff) != 0 && -1 < (int)uVar1) {
        pNVar2 = p->pNfObjs;
        printf("%5d : ",uVar6 & 0xffffffff);
        printf("Dp = %6.2f  ",
               (double)((float)*(int *)((long)(pNVar2->M + -2) + 0x10 + lVar4) / 1000.0));
        printf("Dn = %6.2f  ",
               (double)((float)*(int *)((long)(pNVar2->M + -1) + 0x10 + lVar4) / 1000.0));
        printf("  ");
        printf("Ap = %6.2f  ",(double)((float)*(int *)((long)(pNVar2->M + -1) + lVar4) / 1000.0));
        printf("An = %6.2f  ",(double)((float)*(int *)(&pNVar2->M[0][0].field_0x0 + lVar4) / 1000.0)
              );
        printf("  ");
        printf("Dp = %8s ",
               *(undefined8 *)
                ((long)p->pCells->iDelays +
                ((ulong)((*(uint *)((long)(pNVar2->M + -2) + 8 + lVar4) & 0xfffff) * 0x50) - 0x2c)))
        ;
        printf("Dn = %8s ",
               *(undefined8 *)
                ((long)p->pCells->iDelays +
                ((ulong)((*(uint *)((long)(pNVar2->M + -1) + 8 + lVar4) & 0xfffff) * 0x50) - 0x2c)))
        ;
        printf("Ap = %8s ",
               *(undefined8 *)
                ((long)p->pCells->iDelays +
                ((ulong)((*(uint *)((long)(pNVar2->M + -2) + 0x18 + lVar4) & 0xfffff) * 0x50) - 0x2c
                )));
        printf("An = %8s ",
               *(undefined8 *)
                ((long)p->pCells->iDelays +
                ((ulong)((*(uint *)((long)(pNVar2->M + -1) + 0x18 + lVar4) & 0xfffff) * 0x50) - 0x2c
                )));
        putchar(10);
      }
      uVar6 = uVar6 + 1;
      pGVar3 = p->pGia;
      lVar5 = lVar5 + 0xc;
      lVar4 = lVar4 + 0x40;
    } while ((long)uVar6 < (long)pGVar3->nObjs);
  }
  return;
}

Assistant:

void Nf_ManPrintMatches( Nf_Man_t * p )
{
    Gia_Obj_t * pObj; int i;
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        Nf_Mat_t * pDp = Nf_ObjMatchD( p, i, 0 );
        Nf_Mat_t * pAp = Nf_ObjMatchA( p, i, 0 );
        Nf_Mat_t * pDn = Nf_ObjMatchD( p, i, 1 );
        Nf_Mat_t * pAn = Nf_ObjMatchA( p, i, 1 );

        printf( "%5d : ", i );
        printf( "Dp = %6.2f  ", Scl_Int2Flt(pDp->D) );
        printf( "Dn = %6.2f  ", Scl_Int2Flt(pDn->D) );
        printf( "  " );
        printf( "Ap = %6.2f  ", Scl_Int2Flt(pAp->D) );
        printf( "An = %6.2f  ", Scl_Int2Flt(pAn->D) );
        printf( "  " );
        printf( "Dp = %8s ", Nf_ManCell(p, pDp->Gate)->pName );
        printf( "Dn = %8s ", Nf_ManCell(p, pDn->Gate)->pName );
        printf( "Ap = %8s ", Nf_ManCell(p, pAp->Gate)->pName );
        printf( "An = %8s ", Nf_ManCell(p, pAn->Gate)->pName );
        printf( "\n" );

    }
}